

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

void __thiscall CMU462::EdgeRecord::EdgeRecord(EdgeRecord *this,EdgeIter *_edge)

{
  _List_node_base *p_Var1;
  Vector3D *pVVar2;
  Vector3D *pVVar3;
  EdgeRecord *pEVar4;
  _List_node_base *p_Var5;
  double *pdVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  _List_node_base *p_Var12;
  double dVar13;
  double dVar14;
  _List_node_base *p_Var15;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  _List_node_base *p_Var18;
  _List_node_base *p_Var19;
  double dVar20;
  double local_278;
  double dStack_270;
  double local_268;
  Vector3D local_258;
  double local_238;
  double dStack_230;
  _List_node_base *local_228;
  undefined8 uStack_220;
  Vector3D local_218;
  EdgeRecord *local_200;
  Matrix3x3 local_1f8;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  _List_node_base *local_168;
  undefined8 uStack_160;
  _List_node_base *local_158;
  _List_node_base *p_Stack_150;
  Matrix3x3 A;
  Matrix4x4 K;
  double A_data [9];
  
  p_Var15 = _edge->_M_node;
  (this->edge)._M_node = p_Var15;
  (this->optimalPoint).x = 0.0;
  (this->optimalPoint).y = 0.0;
  (this->optimalPoint).z = 0.0;
  this->score = 0.0;
  p_Var15 = p_Var15[5]._M_prev;
  local_200 = this;
  Matrix4x4::operator+
            (&K,(Matrix4x4 *)&p_Var15[2]._M_next[4]._M_prev,
             (Matrix4x4 *)&p_Var15[1]._M_next[2]._M_next[4]._M_prev);
  pdVar6 = Matrix4x4::operator()(&K,0,0);
  A_data[0] = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,0,1);
  A_data[1] = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,0,2);
  A_data[2] = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,1,0);
  A_data[3] = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,1,1);
  A_data[4] = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,1,2);
  A_data[5] = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,2,0);
  A_data[6] = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,2,1);
  A_data[7] = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,2,2);
  A_data[8] = *pdVar6;
  Matrix3x3::Matrix3x3(&A,A_data);
  pdVar6 = Matrix4x4::operator()(&K,0,3);
  dVar11 = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,1,3);
  dVar14 = *pdVar6;
  pdVar6 = Matrix4x4::operator()(&K,2,3);
  local_238 = -*pdVar6;
  dVar11 = -dVar11;
  dVar14 = -dVar14;
  dStack_230 = -0.0;
  local_218.x = dVar11;
  local_218.y = dVar14;
  local_218.z = local_238;
  dVar20 = Matrix3x3::det(&A);
  if (dVar20 <= 0.01) {
    p_Var17 = p_Var15[2]._M_next;
    p_Var1 = p_Var17[1]._M_next;
    p_Var16 = p_Var17[1]._M_prev;
    p_Var17 = p_Var17[2]._M_next;
    p_Var15 = p_Var15[1]._M_next[2]._M_next;
    local_258.x = (double)p_Var15[1]._M_next;
    p_Var12 = p_Var15[1]._M_prev;
    p_Var15 = p_Var15[2]._M_next;
    dStack_230 = local_238;
    local_258.y = (double)p_Var12;
    local_258.z = (double)p_Var15;
    local_1f8.entries[0].x = (double)p_Var1;
    local_1f8.entries[0].y = (double)p_Var16;
    local_1f8.entries[0].z = (double)p_Var17;
    local_1a8 = dVar11;
    dStack_1a0 = dVar11;
    while (0.0001 < ((double)p_Var17 - (double)p_Var15) * ((double)p_Var17 - (double)p_Var15) +
                    ((double)p_Var1 - local_258.x) * ((double)p_Var1 - local_258.x) +
                    ((double)p_Var16 - (double)p_Var12) * ((double)p_Var16 - (double)p_Var12)) {
      Matrix3x3::operator*(&A,local_1f8.entries);
      local_158 = (_List_node_base *)local_1f8.entries[0].x;
      p_Stack_150 = (_List_node_base *)local_1f8.entries[0].y;
      local_178 = local_278;
      local_198 = dStack_270;
      local_168 = (_List_node_base *)local_1f8.entries[0].y;
      uStack_160 = 0;
      local_228 = (_List_node_base *)local_1f8.entries[0].z;
      uStack_220 = 0;
      local_188 = local_268;
      uStack_180 = 0;
      Matrix3x3::operator*(&A,&local_258);
      dVar11 = (double)local_228 * local_238 +
               (double)local_158 * local_1a8 + (double)local_168 * dVar14;
      dVar20 = local_258.z * dStack_230 + local_258.x * dStack_1a0 + local_258.y * dVar14;
      p_Var1 = (_List_node_base *)((local_258.x + local_1f8.entries[0].x) * 0.5);
      p_Var18 = (_List_node_base *)((local_258.y + local_1f8.entries[0].y) * 0.5);
      p_Var19 = (_List_node_base *)((local_258.z + local_1f8.entries[0].z) * 0.5);
      p_Var12 = p_Var18;
      p_Var15 = p_Var19;
      p_Var16 = (_List_node_base *)local_1f8.entries[0].y;
      p_Var17 = (_List_node_base *)local_1f8.entries[0].z;
      p_Var5 = p_Var1;
      pVVar2 = &local_258;
      pVVar3 = &local_258;
      if ((local_268 * local_258.z + local_278 * local_258.x + dStack_270 * local_258.y) -
          (dVar20 + dVar20) <
          (local_188 * (double)local_228 +
          local_178 * (double)local_158 + local_198 * (double)local_168) - (dVar11 + dVar11)) {
        p_Var12 = (_List_node_base *)local_258.y;
        p_Var15 = (_List_node_base *)local_258.z;
        p_Var16 = p_Var18;
        p_Var17 = p_Var19;
        p_Var5 = (_List_node_base *)local_258.x;
        local_1f8.entries[0].x = (double)p_Var1;
        pVVar2 = local_1f8.entries;
        pVVar3 = local_1f8.entries;
      }
      local_258.x = (double)p_Var5;
      p_Var1 = (_List_node_base *)local_1f8.entries[0].x;
      pVVar2->y = (double)p_Var18;
      pVVar3->z = (double)p_Var19;
    }
    (this->optimalPoint).z = local_1f8.entries[0].z;
    uVar7 = local_1f8.entries[0].x._0_4_;
    uVar8 = local_1f8.entries[0].x._4_4_;
    uVar9 = local_1f8.entries[0].y._0_4_;
    uVar10 = local_1f8.entries[0].y._4_4_;
  }
  else {
    Matrix3x3::inv(&local_1f8,&A);
    Matrix3x3::operator*(&local_1f8,&local_218);
    (this->optimalPoint).z = local_258.z;
    uVar7 = local_258.x._0_4_;
    uVar8 = local_258.x._4_4_;
    uVar9 = local_258.y._0_4_;
    uVar10 = local_258.y._4_4_;
  }
  *(undefined4 *)&(this->optimalPoint).x = uVar7;
  *(undefined4 *)((long)&(this->optimalPoint).x + 4) = uVar8;
  *(undefined4 *)&(this->optimalPoint).y = uVar9;
  *(undefined4 *)((long)&(this->optimalPoint).y + 4) = uVar10;
  Matrix3x3::operator*(&A,&this->optimalPoint);
  pEVar4 = local_200;
  dVar11 = (local_200->optimalPoint).x;
  dVar14 = (local_200->optimalPoint).y;
  dVar20 = (local_200->optimalPoint).z;
  dVar13 = dVar20 * local_218.z + dVar11 * local_218.x + dVar14 * local_218.y;
  local_228 = (_List_node_base *)
              ((local_1f8.entries[0].z * dVar20 +
               local_1f8.entries[0].x * dVar11 + local_1f8.entries[0].y * dVar14) -
              (dVar13 + dVar13));
  pdVar6 = Matrix4x4::operator()(&K,3,3);
  pEVar4->score = (double)local_228 + *pdVar6;
  return;
}

Assistant:

EdgeRecord::EdgeRecord(EdgeIter& _edge) : edge(_edge) {
  // Compute the combined quadric from the edge endpoints.

  auto h = edge->halfedge();
  auto K = h->vertex()->quadric + h->twin()->vertex()->quadric;

  // -> Build the 3x3 linear system whose solution minimizes the quadric error
  //    associated with these two endpoints.

  double A_data[9] = { K(0,0), K(0,1), K(0,2),
                       K(1,0), K(1,1), K(1,2),
                       K(2,0), K(2,1), K(2,2) };
  auto A = Matrix3x3(A_data);
  auto b = Vector3D(-K(0,3), -K(1,3), -K(2,3));

  // -> Use this system to solve for the optimal position, and store it in
  //    EdgeRecord::optimalPoint.

  if (A.det() > 0.01) {
    optimalPoint = A.inv() * b;
  } else {
//    cerr << "detA is too small: " << A.det() << endl;
//    cerr << "inverse answer: " << A.inv() * b << endl;

    auto p0 = h->vertex()->position, p1 = h->twin()->vertex()->position;
    while ((p0 - p1).norm2() > 0.0001) {
      auto c0 = dot(p0, A * p0) - 2 * dot(b, p0),
           c1 = dot(p1, A * p1) - 2 * dot(b, p1);
      if (c0 > c1) {
        p0 = (p0 + p1) / 2;
      } else {
        p1 = (p0 + p1) / 2;
      }
    }
    optimalPoint = p0;

//    cerr << "actual answer: " << optimalPoint << endl << endl;
  }

  // -> Also store the cost associated with collapsing this edg in
  //    EdgeRecord::Cost.

  score = dot(optimalPoint, A * optimalPoint) - 2 * dot(b, optimalPoint) + K(3,3);
}